

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_engine.cpp
# Opt level: O2

int64_t __thiscall
spoa::AlignmentEngine::WorstCaseAlignmentScore(AlignmentEngine *this,int64_t i,int64_t j)

{
  char cVar1;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  anon_class_8_1_8991fb9c gap_score;
  anon_class_8_1_8991fb9c local_30;
  
  lVar4 = j - i;
  iVar3 = i;
  if (j < i) {
    iVar3 = j;
  }
  cVar1 = this->m_;
  if (lVar4 < 0) {
    lVar4 = -lVar4;
  }
  local_30.this = this;
  iVar2 = WorstCaseAlignmentScore::anon_class_8_1_8991fb9c::operator()(&local_30,lVar4);
  lVar5 = iVar2 + iVar3 * cVar1;
  lVar6 = -lVar5;
  iVar3 = WorstCaseAlignmentScore::anon_class_8_1_8991fb9c::operator()(&local_30,i);
  iVar2 = WorstCaseAlignmentScore::anon_class_8_1_8991fb9c::operator()(&local_30,j);
  lVar4 = iVar2 + iVar3;
  if (SBORROW8(lVar4,lVar6) == lVar4 + lVar5 < 0) {
    lVar4 = lVar6;
  }
  return lVar4;
}

Assistant:

std::int64_t AlignmentEngine::WorstCaseAlignmentScore(
    std::int64_t i,
    std::int64_t j) const {
  auto gap_score = [&] (std::int64_t len) -> std::int64_t {
    return len == 0 ? 0 : std::min(g_ + (len - 1) * e_, q_ + (len - 1) * c_);
  };
  return std::min(
      -1 * (m_ * std::min(i, j) + gap_score(std::abs(i - j))),
      gap_score(i) + gap_score(j));
}